

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreencommon.cpp
# Opt level: O3

QOffscreenBackingStore * __thiscall
QOffscreenBackingStore::grabWindow(QOffscreenBackingStore *this,WId window,QRect *rect)

{
  Representation RVar1;
  Representation RVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  QRect local_68 [2];
  undefined1 local_48 [16];
  QRect local_38;
  QRect *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_68[0].x1.m_i = 0;
  local_68[0].y1.m_i = 0;
  local_68[0].x2.m_i = -1;
  local_68[0].y2.m_i = -1;
  local_28 = rect;
  local_38 = QHash<unsigned_long_long,_QRect>::value
                       ((QHash<unsigned_long_long,_QRect> *)(window + 0x28),
                        (unsigned_long_long *)&local_28,local_68);
  RVar1 = local_38.x1.m_i;
  RVar2 = local_38.y1.m_i;
  if (RVar2.m_i + -1 != local_38.y2.m_i.m_i || RVar1.m_i + -1 != local_38.x2.m_i.m_i) {
    uVar5 = *in_RCX;
    uVar6 = in_RCX[1];
    local_48._8_4_ = (undefined4)uVar6;
    local_48._0_4_ = (undefined4)uVar5;
    local_48._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    iVar3 = (local_38.x2.m_i.m_i - RVar1.m_i) + local_48._0_4_;
    if (0 < (local_48._8_4_ - local_48._0_4_) + 1) {
      iVar3 = local_48._8_4_;
    }
    local_48._12_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    iVar4 = (local_38.y2.m_i.m_i - RVar2.m_i) + local_48._4_4_;
    if (0 < (local_48._12_4_ - local_48._4_4_) + 1) {
      iVar4 = local_48._12_4_;
    }
    local_68[0].x1.m_i = local_48._0_4_ + RVar1.m_i;
    local_68[0].x2.m_i = iVar3 + RVar1.m_i;
    local_68[0].y1.m_i = local_48._4_4_ + RVar2.m_i;
    local_68[0].y2.m_i = iVar4 + RVar2.m_i;
    local_48._0_8_ = uVar5;
    local_48._8_8_ = uVar6;
    local_48 = QRect::operator&(local_68,&local_38);
    if ((local_48._0_4_ <= local_48._8_4_) && (local_48._4_4_ <= local_48._12_4_)) {
      QImage::copy(local_68);
      QPixmap::fromImageInPlace(this,local_68,0);
      QImage::~QImage((QImage *)local_68);
      goto LAB_0010c420;
    }
  }
  QPixmap::QPixmap((QPixmap *)this);
LAB_0010c420:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QOffscreenBackingStore::grabWindow(WId window, const QRect &rect) const
{
    QRect area = m_windowAreaHash.value(window, QRect());
    if (area.isNull())
        return QPixmap();

    QRect adjusted = rect;
    if (adjusted.width() <= 0)
        adjusted.setWidth(area.width());
    if (adjusted.height() <= 0)
        adjusted.setHeight(area.height());

    adjusted = adjusted.translated(area.topLeft()) & area;

    if (adjusted.isEmpty())
        return QPixmap();

    return QPixmap::fromImage(m_image.copy(adjusted));
}